

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

string * __thiscall
cmFileAPI::NoSupportedVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmFileAPI *this,
          vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *versions)

{
  cmake *pcVar1;
  ostream *poVar2;
  RequestVersion *v;
  cmake *pcVar3;
  ostringstream msg;
  ostream oStack_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
  std::operator<<(&oStack_1a8,"no supported version specified");
  if (this->CMakeInstance != (cmake *)(this->APIv1)._M_dataplus._M_p) {
    std::operator<<(&oStack_1a8," among:");
    pcVar1 = (cmake *)(this->APIv1)._M_dataplus._M_p;
    for (pcVar3 = this->CMakeInstance; pcVar3 != pcVar1;
        pcVar3 = (cmake *)&(pcVar3->Generators).
                           super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish) {
      poVar2 = std::operator<<(&oStack_1a8," ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,".");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::NoSupportedVersion(
  std::vector<RequestVersion> const& versions)
{
  std::ostringstream msg;
  msg << "no supported version specified";
  if (!versions.empty()) {
    msg << " among:";
    for (RequestVersion const& v : versions) {
      msg << " " << v.Major << "." << v.Minor;
    }
  }
  return msg.str();
}